

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

intptr_t http_connect(char *url,char *unix_address,http_settings_s arg_settings)

{
  fio_str_info_s n;
  fio_connect_args args;
  fio_connect_args args_00;
  http_settings_s arg_settings_00;
  undefined1 auVar1 [24];
  undefined1 auVar2 [16];
  undefined1 auVar3 [104];
  bool bVar4;
  size_t sVar5;
  _func_void_http_s_ptr_char_ptr_size_t *p_Var6;
  void *pvVar7;
  char *pcVar8;
  size_t sVar9;
  size_t sVar10;
  intptr_t iVar11;
  void *pvVar12;
  intptr_t iVar13;
  intptr_t iVar14;
  intptr_t iVar15;
  size_t sVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  undefined6 uVar19;
  int *piVar20;
  size_t sVar21;
  http_settings_s *phVar22;
  http_s *r;
  http_vtable_s *vtbl;
  bool bVar23;
  size_t sVar24;
  undefined8 in_stack_fffffffffffffe08;
  http_s *h_00;
  uint7 uStack_19f;
  uint7 uStack_167;
  intptr_t local_160;
  intptr_t ret;
  http_s *h;
  http_settings_s *settings;
  fio_url_s u;
  FIOBJ path;
  uint8_t is_secure;
  char *pcStack_48;
  uint8_t is_websocket;
  char *host;
  char *p;
  char *a;
  size_t h_len;
  size_t len;
  char *unix_address_local;
  char *url_local;
  
  auVar2 = arg_settings._0_16_;
  auVar3 = arg_settings._24_104_;
  arg_settings._0_16_ = auVar2;
  arg_settings._24_104_ = auVar3;
  if ((arg_settings.on_response == (_func_void_http_s_ptr *)0x0) &&
     (arg_settings.on_upgrade == (_func_void_http_s_ptr_char_ptr_size_t *)0x0)) {
    if (1 < FIO_LOG_LEVEL) {
      iVar11 = arg_settings.reserved3;
      sVar9 = arg_settings.ws_max_msg_size;
      iVar13 = arg_settings.reserved2;
      pvVar7 = arg_settings.tls;
      uVar17 = arg_settings.ws_timeout;
      pcVar8 = arg_settings.public_folder;
      uVar18 = arg_settings.timeout;
      uVar19 = arg_settings._122_6_;
      sVar24 = arg_settings.max_header_size;
      sVar10 = arg_settings.max_body_size;
      p_Var6 = arg_settings.on_upgrade;
      pvVar12 = arg_settings.udata;
      iVar14 = arg_settings.max_clients;
      sVar16 = arg_settings.public_folder_length;
      iVar15 = arg_settings.reserved1;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      arg_settings.on_upgrade = p_Var6;
      arg_settings.udata = pvVar12;
      arg_settings.public_folder = pcVar8;
      arg_settings.public_folder_length = sVar16;
      arg_settings.max_header_size = sVar24;
      arg_settings.max_body_size = sVar10;
      arg_settings.max_clients = iVar14;
      arg_settings.tls = pvVar7;
      arg_settings.reserved1 = iVar15;
      arg_settings.reserved2 = iVar13;
      arg_settings.reserved3 = iVar11;
      arg_settings.ws_max_msg_size = sVar9;
      arg_settings.timeout = uVar18;
      arg_settings.ws_timeout = uVar17;
      arg_settings._122_6_ = uVar19;
      FIO_LOG2STDERR(
                    "ERROR: http_connect requires either an on_response  or an on_upgrade callback.\n"
                    );
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
    }
    arg_settings._24_104_ = auVar3;
    arg_settings._0_16_ = auVar2;
    uVar19 = arg_settings._122_6_;
    uVar18 = arg_settings.ws_timeout;
    uVar17 = arg_settings.timeout;
    sVar16 = arg_settings.ws_max_msg_size;
    iVar15 = arg_settings.reserved3;
    iVar14 = arg_settings.reserved2;
    iVar13 = arg_settings.reserved1;
    pvVar12 = arg_settings.tls;
    iVar11 = arg_settings.max_clients;
    sVar10 = arg_settings.max_body_size;
    sVar24 = arg_settings.max_header_size;
    sVar9 = arg_settings.public_folder_length;
    pcVar8 = arg_settings.public_folder;
    pvVar7 = arg_settings.udata;
    p_Var6 = arg_settings.on_upgrade;
    auVar2 = (undefined1  [16])arg_settings._0_16_;
    auVar3 = (undefined1  [104])arg_settings._24_104_;
    arg_settings.on_upgrade = p_Var6;
    arg_settings.udata = pvVar7;
    arg_settings.public_folder = pcVar8;
    arg_settings.public_folder_length = sVar9;
    arg_settings.max_header_size = sVar24;
    arg_settings.max_body_size = sVar10;
    arg_settings.max_clients = iVar11;
    arg_settings.tls = pvVar12;
    arg_settings.reserved1 = iVar13;
    arg_settings.reserved2 = iVar14;
    arg_settings.reserved3 = iVar15;
    arg_settings.ws_max_msg_size = sVar16;
    arg_settings.timeout = uVar17;
    arg_settings.ws_timeout = uVar18;
    arg_settings._122_6_ = uVar19;
    piVar20 = __errno_location();
    auVar3 = (undefined1  [104])arg_settings._24_104_;
    auVar2 = (undefined1  [16])arg_settings._0_16_;
    *piVar20 = 0x16;
  }
  else {
    a = (char *)0x0;
    p = (char *)0x0;
    host = (char *)0x0;
    pcStack_48 = (char *)0x0;
    bVar4 = false;
    bVar23 = false;
    u.target.data = (char *)0x0;
    if ((url != (char *)0x0) || (unix_address != (char *)0x0)) {
      p_Var6 = arg_settings.on_upgrade;
      pvVar7 = arg_settings.udata;
      pcVar8 = arg_settings.public_folder;
      sVar9 = arg_settings.public_folder_length;
      sVar24 = arg_settings.max_header_size;
      sVar10 = arg_settings.max_body_size;
      iVar11 = arg_settings.max_clients;
      pvVar12 = arg_settings.tls;
      iVar13 = arg_settings.reserved1;
      iVar14 = arg_settings.reserved2;
      iVar15 = arg_settings.reserved3;
      sVar16 = arg_settings.ws_max_msg_size;
      uVar17 = arg_settings.timeout;
      uVar18 = arg_settings.ws_timeout;
      uVar19 = arg_settings._122_6_;
      if (url != (char *)0x0) {
        iVar11 = arg_settings.reserved3;
        sVar9 = arg_settings.ws_max_msg_size;
        iVar13 = arg_settings.reserved2;
        pvVar7 = arg_settings.tls;
        uVar17 = arg_settings.ws_timeout;
        uVar18 = arg_settings.timeout;
        pvVar12 = arg_settings.udata;
        iVar14 = arg_settings.max_clients;
        sVar16 = arg_settings.public_folder_length;
        iVar15 = arg_settings.reserved1;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        arg_settings.on_upgrade = p_Var6;
        arg_settings.udata = pvVar12;
        arg_settings.public_folder = pcVar8;
        arg_settings.public_folder_length = sVar16;
        arg_settings.max_header_size = sVar24;
        arg_settings.max_body_size = sVar10;
        arg_settings.max_clients = iVar14;
        arg_settings.tls = pvVar7;
        arg_settings.reserved1 = iVar15;
        arg_settings.reserved2 = iVar13;
        arg_settings.reserved3 = iVar11;
        arg_settings.ws_max_msg_size = sVar9;
        arg_settings.timeout = uVar18;
        arg_settings.ws_timeout = uVar17;
        arg_settings._122_6_ = uVar19;
        sVar21 = strlen(url);
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        iVar11 = arg_settings.reserved3;
        sVar9 = arg_settings.ws_max_msg_size;
        iVar13 = arg_settings.reserved2;
        pvVar7 = arg_settings.tls;
        uVar17 = arg_settings.ws_timeout;
        pcVar8 = arg_settings.public_folder;
        uVar18 = arg_settings.timeout;
        uVar19 = arg_settings._122_6_;
        sVar24 = arg_settings.max_header_size;
        sVar10 = arg_settings.max_body_size;
        p_Var6 = arg_settings.on_upgrade;
        pvVar12 = arg_settings.udata;
        iVar14 = arg_settings.max_clients;
        sVar16 = arg_settings.public_folder_length;
        iVar15 = arg_settings.reserved1;
        arg_settings._0_16_ = auVar2;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        arg_settings._24_104_ = auVar3;
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        arg_settings.on_upgrade = p_Var6;
        arg_settings.udata = pvVar12;
        arg_settings.public_folder = pcVar8;
        arg_settings.public_folder_length = sVar16;
        arg_settings.max_header_size = sVar24;
        arg_settings.max_body_size = sVar10;
        arg_settings.max_clients = iVar14;
        arg_settings.tls = pvVar7;
        arg_settings.reserved1 = iVar15;
        arg_settings.reserved2 = iVar13;
        arg_settings.reserved3 = iVar11;
        arg_settings.ws_max_msg_size = sVar9;
        arg_settings.timeout = uVar18;
        arg_settings.ws_timeout = uVar17;
        arg_settings._122_6_ = uVar19;
        fio_url_parse((fio_url_s *)&settings,url,sVar21);
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        if (((u.scheme.len == 0) ||
            (((u.scheme.capa != 2 && ((u.scheme.capa != 3 || (*(char *)(u.scheme.len + 2) != 's'))))
             || (*(char *)u.scheme.len != 'w')))) || (*(char *)(u.scheme.len + 1) != 's')) {
          if (((u.scheme.len != 0) &&
              ((u.scheme.capa == 4 || ((u.scheme.capa == 5 && (*(char *)(u.scheme.len + 4) == 's')))
               ))) && ((*(char *)u.scheme.len == 'h' &&
                       (((*(char *)(u.scheme.len + 1) == 't' && (*(char *)(u.scheme.len + 2) == 't')
                         ) && (*(char *)(u.scheme.len + 3) == 'p')))))) {
            bVar23 = u.scheme.capa == 5;
          }
        }
        else {
          bVar4 = true;
          bVar23 = u.scheme.capa == 3;
        }
        arg_settings._0_16_ = auVar2;
        arg_settings._24_104_ = auVar3;
        if ((bVar23) && (arg_settings.tls == (void *)0x0)) {
          if (1 < FIO_LOG_LEVEL) {
            iVar11 = arg_settings.reserved3;
            sVar9 = arg_settings.ws_max_msg_size;
            iVar13 = arg_settings.reserved2;
            pvVar7 = arg_settings.tls;
            uVar17 = arg_settings.ws_timeout;
            pcVar8 = arg_settings.public_folder;
            uVar18 = arg_settings.timeout;
            uVar19 = arg_settings._122_6_;
            sVar24 = arg_settings.max_header_size;
            sVar10 = arg_settings.max_body_size;
            p_Var6 = arg_settings.on_upgrade;
            pvVar12 = arg_settings.udata;
            iVar14 = arg_settings.max_clients;
            sVar16 = arg_settings.public_folder_length;
            iVar15 = arg_settings.reserved1;
            auVar2 = (undefined1  [16])arg_settings._0_16_;
            auVar3 = (undefined1  [104])arg_settings._24_104_;
            arg_settings.on_upgrade = p_Var6;
            arg_settings.udata = pvVar12;
            arg_settings.public_folder = pcVar8;
            arg_settings.public_folder_length = sVar16;
            arg_settings.max_header_size = sVar24;
            arg_settings.max_body_size = sVar10;
            arg_settings.max_clients = iVar14;
            arg_settings.tls = pvVar7;
            arg_settings.reserved1 = iVar15;
            arg_settings.reserved2 = iVar13;
            arg_settings.reserved3 = iVar11;
            arg_settings.ws_max_msg_size = sVar9;
            arg_settings.timeout = uVar18;
            arg_settings.ws_timeout = uVar17;
            arg_settings._122_6_ = uVar19;
            FIO_LOG2STDERR("ERROR: Secure connections (%.*s) require a TLS object.",
                           u.scheme.capa & 0xffffffff,u.scheme.len);
            auVar3 = (undefined1  [104])arg_settings._24_104_;
            auVar2 = (undefined1  [16])arg_settings._0_16_;
          }
          arg_settings._24_104_ = auVar3;
          arg_settings._0_16_ = auVar2;
          uVar19 = arg_settings._122_6_;
          uVar18 = arg_settings.ws_timeout;
          uVar17 = arg_settings.timeout;
          sVar16 = arg_settings.ws_max_msg_size;
          iVar15 = arg_settings.reserved3;
          iVar14 = arg_settings.reserved2;
          iVar13 = arg_settings.reserved1;
          pvVar12 = arg_settings.tls;
          iVar11 = arg_settings.max_clients;
          sVar10 = arg_settings.max_body_size;
          sVar24 = arg_settings.max_header_size;
          sVar9 = arg_settings.public_folder_length;
          pcVar8 = arg_settings.public_folder;
          pvVar7 = arg_settings.udata;
          p_Var6 = arg_settings.on_upgrade;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          arg_settings.on_upgrade = p_Var6;
          arg_settings.udata = pvVar7;
          arg_settings.public_folder = pcVar8;
          arg_settings.public_folder_length = sVar9;
          arg_settings.max_header_size = sVar24;
          arg_settings.max_body_size = sVar10;
          arg_settings.max_clients = iVar11;
          arg_settings.tls = pvVar12;
          arg_settings.reserved1 = iVar13;
          arg_settings.reserved2 = iVar14;
          arg_settings.reserved3 = iVar15;
          arg_settings.ws_max_msg_size = sVar16;
          arg_settings.timeout = uVar17;
          arg_settings.ws_timeout = uVar18;
          arg_settings._122_6_ = uVar19;
          piVar20 = __errno_location();
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          *piVar20 = 0x16;
          goto LAB_0017403b;
        }
        if (u.path.len != 0) {
          iVar11 = arg_settings.reserved3;
          sVar9 = arg_settings.ws_max_msg_size;
          iVar13 = arg_settings.reserved2;
          pvVar7 = arg_settings.tls;
          uVar17 = arg_settings.ws_timeout;
          pcVar8 = arg_settings.public_folder;
          uVar18 = arg_settings.timeout;
          uVar19 = arg_settings._122_6_;
          sVar24 = arg_settings.max_header_size;
          sVar10 = arg_settings.max_body_size;
          p_Var6 = arg_settings.on_upgrade;
          pvVar12 = arg_settings.udata;
          iVar14 = arg_settings.max_clients;
          sVar16 = arg_settings.public_folder_length;
          iVar15 = arg_settings.reserved1;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          arg_settings.on_upgrade = p_Var6;
          arg_settings.udata = pvVar12;
          arg_settings.public_folder = pcVar8;
          arg_settings.public_folder_length = sVar16;
          arg_settings.max_header_size = sVar24;
          arg_settings.max_body_size = sVar10;
          arg_settings.max_clients = iVar14;
          arg_settings.tls = pvVar7;
          arg_settings.reserved1 = iVar15;
          arg_settings.reserved2 = iVar13;
          arg_settings.reserved3 = iVar11;
          arg_settings.ws_max_msg_size = sVar9;
          arg_settings.timeout = uVar18;
          arg_settings.ws_timeout = uVar17;
          arg_settings._122_6_ = uVar19;
          sVar21 = strlen((char *)u.path.len);
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          iVar11 = arg_settings.reserved3;
          sVar9 = arg_settings.ws_max_msg_size;
          iVar13 = arg_settings.reserved2;
          pvVar7 = arg_settings.tls;
          uVar17 = arg_settings.ws_timeout;
          pcVar8 = arg_settings.public_folder;
          uVar18 = arg_settings.timeout;
          uVar19 = arg_settings._122_6_;
          sVar24 = arg_settings.max_header_size;
          sVar10 = arg_settings.max_body_size;
          p_Var6 = arg_settings.on_upgrade;
          pvVar12 = arg_settings.udata;
          iVar14 = arg_settings.max_clients;
          sVar16 = arg_settings.public_folder_length;
          iVar15 = arg_settings.reserved1;
          arg_settings._0_16_ = auVar2;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          arg_settings._24_104_ = auVar3;
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          arg_settings.on_upgrade = p_Var6;
          arg_settings.udata = pvVar12;
          arg_settings.public_folder = pcVar8;
          arg_settings.public_folder_length = sVar16;
          arg_settings.max_header_size = sVar24;
          arg_settings.max_body_size = sVar10;
          arg_settings.max_clients = iVar14;
          arg_settings.tls = pvVar7;
          arg_settings.reserved1 = iVar15;
          arg_settings.reserved2 = iVar13;
          arg_settings.reserved3 = iVar11;
          arg_settings.ws_max_msg_size = sVar9;
          arg_settings.timeout = uVar18;
          arg_settings.ws_timeout = uVar17;
          arg_settings._122_6_ = uVar19;
          u.target.data = (char *)fiobj_str_new((char *)u.path.len,sVar21);
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
        }
        arg_settings._24_104_ = auVar3;
        arg_settings._0_16_ = auVar2;
        uVar19 = arg_settings._122_6_;
        uVar18 = arg_settings.ws_timeout;
        uVar17 = arg_settings.timeout;
        sVar16 = arg_settings.ws_max_msg_size;
        iVar15 = arg_settings.reserved3;
        iVar14 = arg_settings.reserved2;
        iVar13 = arg_settings.reserved1;
        pvVar12 = arg_settings.tls;
        iVar11 = arg_settings.max_clients;
        sVar10 = arg_settings.max_body_size;
        sVar24 = arg_settings.max_header_size;
        sVar9 = arg_settings.public_folder_length;
        pcVar8 = arg_settings.public_folder;
        pvVar7 = arg_settings.udata;
        p_Var6 = arg_settings.on_upgrade;
        arg_settings.on_upgrade = p_Var6;
        arg_settings.udata = pvVar7;
        arg_settings.public_folder = pcVar8;
        arg_settings.public_folder_length = sVar9;
        arg_settings.max_header_size = sVar24;
        arg_settings.max_body_size = sVar10;
        arg_settings.max_clients = iVar11;
        arg_settings.tls = pvVar12;
        arg_settings.reserved1 = iVar13;
        arg_settings.reserved2 = iVar14;
        arg_settings.reserved3 = iVar15;
        arg_settings.ws_max_msg_size = sVar16;
        arg_settings.timeout = uVar17;
        arg_settings.ws_timeout = uVar18;
        arg_settings._122_6_ = uVar19;
        if (unix_address == (char *)0x0) {
          if (u.host.len == 0) {
            auVar2 = (undefined1  [16])arg_settings._0_16_;
            auVar3 = (undefined1  [104])arg_settings._24_104_;
            if (1 < FIO_LOG_LEVEL) {
              FIO_LOG2STDERR("ERROR: http_connect requires a valid address.");
              auVar3 = (undefined1  [104])arg_settings._24_104_;
              auVar2 = (undefined1  [16])arg_settings._0_16_;
              p_Var6 = arg_settings.on_upgrade;
              pvVar7 = arg_settings.udata;
              pcVar8 = arg_settings.public_folder;
              sVar9 = arg_settings.public_folder_length;
              sVar24 = arg_settings.max_header_size;
              sVar10 = arg_settings.max_body_size;
              iVar11 = arg_settings.max_clients;
              pvVar12 = arg_settings.tls;
              iVar13 = arg_settings.reserved1;
              iVar14 = arg_settings.reserved2;
              iVar15 = arg_settings.reserved3;
              sVar16 = arg_settings.ws_max_msg_size;
              uVar17 = arg_settings.timeout;
              uVar18 = arg_settings.ws_timeout;
              uVar19 = arg_settings._122_6_;
            }
            arg_settings._122_6_ = uVar19;
            arg_settings.ws_timeout = uVar18;
            arg_settings.timeout = uVar17;
            arg_settings.ws_max_msg_size = sVar16;
            arg_settings.reserved3 = iVar15;
            arg_settings.reserved2 = iVar14;
            arg_settings.reserved1 = iVar13;
            arg_settings.tls = pvVar12;
            arg_settings.max_clients = iVar11;
            arg_settings.max_body_size = sVar10;
            arg_settings.max_header_size = sVar24;
            arg_settings.public_folder_length = sVar9;
            arg_settings.public_folder = pcVar8;
            arg_settings.udata = pvVar7;
            arg_settings.on_upgrade = p_Var6;
            arg_settings._24_104_ = auVar3;
            arg_settings._0_16_ = auVar2;
            uVar19 = arg_settings._122_6_;
            uVar18 = arg_settings.ws_timeout;
            uVar17 = arg_settings.timeout;
            sVar16 = arg_settings.ws_max_msg_size;
            iVar15 = arg_settings.reserved3;
            iVar14 = arg_settings.reserved2;
            iVar13 = arg_settings.reserved1;
            pvVar12 = arg_settings.tls;
            iVar11 = arg_settings.max_clients;
            sVar10 = arg_settings.max_body_size;
            sVar24 = arg_settings.max_header_size;
            sVar9 = arg_settings.public_folder_length;
            pcVar8 = arg_settings.public_folder;
            pvVar7 = arg_settings.udata;
            p_Var6 = arg_settings.on_upgrade;
            auVar2 = (undefined1  [16])arg_settings._0_16_;
            auVar3 = (undefined1  [104])arg_settings._24_104_;
            arg_settings.on_upgrade = p_Var6;
            arg_settings.udata = pvVar7;
            arg_settings.public_folder = pcVar8;
            arg_settings.public_folder_length = sVar9;
            arg_settings.max_header_size = sVar24;
            arg_settings.max_body_size = sVar10;
            arg_settings.max_clients = iVar11;
            arg_settings.tls = pvVar12;
            arg_settings.reserved1 = iVar13;
            arg_settings.reserved2 = iVar14;
            arg_settings.reserved3 = iVar15;
            arg_settings.ws_max_msg_size = sVar16;
            arg_settings.timeout = uVar17;
            arg_settings.ws_timeout = uVar18;
            arg_settings._122_6_ = uVar19;
            piVar20 = __errno_location();
            auVar3 = (undefined1  [104])arg_settings._24_104_;
            auVar2 = (undefined1  [16])arg_settings._0_16_;
            *piVar20 = 0x16;
            goto LAB_0017403b;
          }
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          p = (char *)fio_malloc(u.host.capa + 1);
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          iVar11 = arg_settings.reserved3;
          sVar9 = arg_settings.ws_max_msg_size;
          iVar13 = arg_settings.reserved2;
          pvVar7 = arg_settings.tls;
          uVar17 = arg_settings.ws_timeout;
          pcVar8 = arg_settings.public_folder;
          uVar18 = arg_settings.timeout;
          uVar19 = arg_settings._122_6_;
          sVar24 = arg_settings.max_header_size;
          sVar10 = arg_settings.max_body_size;
          p_Var6 = arg_settings.on_upgrade;
          pvVar12 = arg_settings.udata;
          iVar14 = arg_settings.max_clients;
          sVar16 = arg_settings.public_folder_length;
          iVar15 = arg_settings.reserved1;
          arg_settings._0_16_ = auVar2;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          arg_settings._24_104_ = auVar3;
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          arg_settings.on_upgrade = p_Var6;
          arg_settings.udata = pvVar12;
          arg_settings.public_folder = pcVar8;
          arg_settings.public_folder_length = sVar16;
          arg_settings.max_header_size = sVar24;
          arg_settings.max_body_size = sVar10;
          arg_settings.max_clients = iVar14;
          arg_settings.tls = pvVar7;
          arg_settings.reserved1 = iVar15;
          arg_settings.reserved2 = iVar13;
          arg_settings.reserved3 = iVar11;
          arg_settings.ws_max_msg_size = sVar9;
          arg_settings.timeout = uVar18;
          arg_settings.ws_timeout = uVar17;
          arg_settings._122_6_ = uVar19;
          memcpy(p,(void *)u.host.len,u.host.capa);
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          p[u.host.capa] = '\0';
          arg_settings._0_16_ = auVar2;
          arg_settings._24_104_ = auVar3;
          if (u.port.len == 0) {
            if (bVar23) {
              iVar11 = arg_settings.reserved3;
              sVar9 = arg_settings.ws_max_msg_size;
              iVar13 = arg_settings.reserved2;
              pvVar7 = arg_settings.tls;
              uVar17 = arg_settings.ws_timeout;
              pcVar8 = arg_settings.public_folder;
              uVar18 = arg_settings.timeout;
              uVar19 = arg_settings._122_6_;
              sVar24 = arg_settings.max_header_size;
              sVar10 = arg_settings.max_body_size;
              p_Var6 = arg_settings.on_upgrade;
              pvVar12 = arg_settings.udata;
              iVar14 = arg_settings.max_clients;
              sVar16 = arg_settings.public_folder_length;
              iVar15 = arg_settings.reserved1;
              auVar2 = (undefined1  [16])arg_settings._0_16_;
              auVar3 = (undefined1  [104])arg_settings._24_104_;
              arg_settings.on_upgrade = p_Var6;
              arg_settings.udata = pvVar12;
              arg_settings.public_folder = pcVar8;
              arg_settings.public_folder_length = sVar16;
              arg_settings.max_header_size = sVar24;
              arg_settings.max_body_size = sVar10;
              arg_settings.max_clients = iVar14;
              arg_settings.tls = pvVar7;
              arg_settings.reserved1 = iVar15;
              arg_settings.reserved2 = iVar13;
              arg_settings.reserved3 = iVar11;
              arg_settings.ws_max_msg_size = sVar9;
              arg_settings.timeout = uVar18;
              arg_settings.ws_timeout = uVar17;
              arg_settings._122_6_ = uVar19;
              host = (char *)fio_malloc(4);
              auVar3 = (undefined1  [104])arg_settings._24_104_;
              auVar2 = (undefined1  [16])arg_settings._0_16_;
              builtin_strncpy(host,"443",4);
            }
            else {
              iVar11 = arg_settings.reserved3;
              sVar9 = arg_settings.ws_max_msg_size;
              iVar13 = arg_settings.reserved2;
              pvVar7 = arg_settings.tls;
              uVar17 = arg_settings.ws_timeout;
              pcVar8 = arg_settings.public_folder;
              uVar18 = arg_settings.timeout;
              uVar19 = arg_settings._122_6_;
              sVar24 = arg_settings.max_header_size;
              sVar10 = arg_settings.max_body_size;
              p_Var6 = arg_settings.on_upgrade;
              pvVar12 = arg_settings.udata;
              iVar14 = arg_settings.max_clients;
              sVar16 = arg_settings.public_folder_length;
              iVar15 = arg_settings.reserved1;
              auVar2 = (undefined1  [16])arg_settings._0_16_;
              auVar3 = (undefined1  [104])arg_settings._24_104_;
              arg_settings.on_upgrade = p_Var6;
              arg_settings.udata = pvVar12;
              arg_settings.public_folder = pcVar8;
              arg_settings.public_folder_length = sVar16;
              arg_settings.max_header_size = sVar24;
              arg_settings.max_body_size = sVar10;
              arg_settings.max_clients = iVar14;
              arg_settings.tls = pvVar7;
              arg_settings.reserved1 = iVar15;
              arg_settings.reserved2 = iVar13;
              arg_settings.reserved3 = iVar11;
              arg_settings.ws_max_msg_size = sVar9;
              arg_settings.timeout = uVar18;
              arg_settings.ws_timeout = uVar17;
              arg_settings._122_6_ = uVar19;
              host = (char *)fio_malloc(3);
              auVar3 = (undefined1  [104])arg_settings._24_104_;
              auVar2 = (undefined1  [16])arg_settings._0_16_;
              host[0] = '8';
              host[1] = '0';
              host[2] = '\0';
            }
          }
          else {
            iVar11 = arg_settings.reserved3;
            sVar9 = arg_settings.ws_max_msg_size;
            iVar13 = arg_settings.reserved2;
            pvVar7 = arg_settings.tls;
            uVar17 = arg_settings.ws_timeout;
            pcVar8 = arg_settings.public_folder;
            uVar18 = arg_settings.timeout;
            uVar19 = arg_settings._122_6_;
            sVar24 = arg_settings.max_header_size;
            sVar10 = arg_settings.max_body_size;
            p_Var6 = arg_settings.on_upgrade;
            pvVar12 = arg_settings.udata;
            iVar14 = arg_settings.max_clients;
            sVar16 = arg_settings.public_folder_length;
            iVar15 = arg_settings.reserved1;
            auVar2 = (undefined1  [16])arg_settings._0_16_;
            auVar3 = (undefined1  [104])arg_settings._24_104_;
            arg_settings.on_upgrade = p_Var6;
            arg_settings.udata = pvVar12;
            arg_settings.public_folder = pcVar8;
            arg_settings.public_folder_length = sVar16;
            arg_settings.max_header_size = sVar24;
            arg_settings.max_body_size = sVar10;
            arg_settings.max_clients = iVar14;
            arg_settings.tls = pvVar7;
            arg_settings.reserved1 = iVar15;
            arg_settings.reserved2 = iVar13;
            arg_settings.reserved3 = iVar11;
            arg_settings.ws_max_msg_size = sVar9;
            arg_settings.timeout = uVar18;
            arg_settings.ws_timeout = uVar17;
            arg_settings._122_6_ = uVar19;
            host = (char *)fio_malloc(u.port.capa + 1);
            auVar3 = (undefined1  [104])arg_settings._24_104_;
            auVar2 = (undefined1  [16])arg_settings._0_16_;
            iVar11 = arg_settings.reserved3;
            sVar9 = arg_settings.ws_max_msg_size;
            iVar13 = arg_settings.reserved2;
            pvVar7 = arg_settings.tls;
            uVar17 = arg_settings.ws_timeout;
            pcVar8 = arg_settings.public_folder;
            uVar18 = arg_settings.timeout;
            uVar19 = arg_settings._122_6_;
            sVar24 = arg_settings.max_header_size;
            sVar10 = arg_settings.max_body_size;
            p_Var6 = arg_settings.on_upgrade;
            pvVar12 = arg_settings.udata;
            iVar14 = arg_settings.max_clients;
            sVar16 = arg_settings.public_folder_length;
            iVar15 = arg_settings.reserved1;
            arg_settings._0_16_ = auVar2;
            auVar2 = (undefined1  [16])arg_settings._0_16_;
            arg_settings._24_104_ = auVar3;
            auVar3 = (undefined1  [104])arg_settings._24_104_;
            arg_settings.on_upgrade = p_Var6;
            arg_settings.udata = pvVar12;
            arg_settings.public_folder = pcVar8;
            arg_settings.public_folder_length = sVar16;
            arg_settings.max_header_size = sVar24;
            arg_settings.max_body_size = sVar10;
            arg_settings.max_clients = iVar14;
            arg_settings.tls = pvVar7;
            arg_settings.reserved1 = iVar15;
            arg_settings.reserved2 = iVar13;
            arg_settings.reserved3 = iVar11;
            arg_settings.ws_max_msg_size = sVar9;
            arg_settings.timeout = uVar18;
            arg_settings.ws_timeout = uVar17;
            arg_settings._122_6_ = uVar19;
            memcpy(host,(void *)u.port.len,u.port.capa);
            auVar3 = (undefined1  [104])arg_settings._24_104_;
            auVar2 = (undefined1  [16])arg_settings._0_16_;
            host[u.port.capa] = '\0';
          }
        }
        else {
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          a = (char *)strlen(unix_address);
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          pcStack_48 = unix_address;
          p = unix_address;
        }
        arg_settings._24_104_ = auVar3;
        arg_settings._0_16_ = auVar2;
        uVar19 = arg_settings._122_6_;
        uVar18 = arg_settings.ws_timeout;
        uVar17 = arg_settings.timeout;
        sVar16 = arg_settings.ws_max_msg_size;
        iVar15 = arg_settings.reserved3;
        iVar14 = arg_settings.reserved2;
        iVar13 = arg_settings.reserved1;
        pvVar12 = arg_settings.tls;
        iVar11 = arg_settings.max_clients;
        sVar10 = arg_settings.max_body_size;
        sVar24 = arg_settings.max_header_size;
        sVar9 = arg_settings.public_folder_length;
        pcVar8 = arg_settings.public_folder;
        pvVar7 = arg_settings.udata;
        p_Var6 = arg_settings.on_upgrade;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        if (u.host.len != 0) {
          pcStack_48 = (char *)u.host.len;
          a = (char *)u.host.capa;
        }
      }
      arg_settings._122_6_ = uVar19;
      arg_settings.ws_timeout = uVar18;
      arg_settings.timeout = uVar17;
      arg_settings.ws_max_msg_size = sVar16;
      arg_settings.reserved3 = iVar15;
      arg_settings.reserved2 = iVar14;
      arg_settings.reserved1 = iVar13;
      arg_settings.tls = pvVar12;
      arg_settings.max_clients = iVar11;
      arg_settings.max_body_size = sVar10;
      arg_settings.max_header_size = sVar24;
      arg_settings.public_folder_length = sVar9;
      arg_settings.public_folder = pcVar8;
      arg_settings.udata = pvVar7;
      arg_settings.on_upgrade = p_Var6;
      arg_settings._24_104_ = auVar3;
      arg_settings._0_16_ = auVar2;
      uVar19 = arg_settings._122_6_;
      uVar18 = arg_settings.ws_timeout;
      uVar17 = arg_settings.timeout;
      sVar16 = arg_settings.ws_max_msg_size;
      iVar15 = arg_settings.reserved3;
      iVar14 = arg_settings.reserved2;
      iVar13 = arg_settings.reserved1;
      pvVar12 = arg_settings.tls;
      iVar11 = arg_settings.max_clients;
      sVar10 = arg_settings.max_body_size;
      sVar24 = arg_settings.max_header_size;
      sVar9 = arg_settings.public_folder_length;
      pcVar8 = arg_settings.public_folder;
      pvVar7 = arg_settings.udata;
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      p_Var6 = arg_settings.on_upgrade;
      arg_settings.timeout = uVar17;
      if (uVar17 == '\0') {
        arg_settings.timeout = '\x1e';
      }
      arg_settings_00.on_upgrade = (_func_void_http_s_ptr_char_ptr_size_t *)arg_settings.on_response
      ;
      arg_settings_00.on_request = (_func_void_http_s_ptr *)p_Var6;
      arg_settings_00._16_104_ = auVar3;
      arg_settings_00.on_finish = (_func_void_http_settings_s_ptr *)pvVar7;
      arg_settings_00.udata = pcVar8;
      arg_settings_00.public_folder = (char *)sVar9;
      arg_settings_00.public_folder_length = sVar24;
      arg_settings_00.max_header_size = sVar10;
      arg_settings_00.max_body_size = iVar11;
      arg_settings_00.max_clients = (intptr_t)pvVar12;
      arg_settings_00.tls = (void *)iVar13;
      arg_settings_00.reserved1 = iVar14;
      arg_settings_00.reserved2 = iVar15;
      arg_settings_00.reserved3 = sVar16;
      arg_settings_00.ws_max_msg_size._0_1_ = arg_settings.timeout;
      arg_settings_00.ws_max_msg_size._1_1_ = uVar18;
      arg_settings.log = (uint8_t)uVar19;
      arg_settings.is_client = SUB61(uVar19,1);
      arg_settings._124_4_ = SUB64(uVar19,2);
      arg_settings_00.ws_max_msg_size._2_1_ = arg_settings.log;
      arg_settings_00.ws_max_msg_size._3_1_ = arg_settings.is_client;
      arg_settings_00.ws_max_msg_size._4_4_ = arg_settings._124_4_;
      arg_settings_00.timeout = (char)in_stack_fffffffffffffe08;
      arg_settings_00.ws_timeout = (char)((ulong)in_stack_fffffffffffffe08 >> 8);
      arg_settings_00.log = (char)((ulong)in_stack_fffffffffffffe08 >> 0x10);
      arg_settings_00.is_client = (char)((ulong)in_stack_fffffffffffffe08 >> 0x18);
      arg_settings_00._124_4_ = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
      auVar2 = (undefined1  [16])arg_settings._0_16_;
      uVar17 = arg_settings.timeout;
      arg_settings._24_104_ = auVar3;
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      arg_settings.on_upgrade = p_Var6;
      arg_settings.udata = pvVar7;
      arg_settings.public_folder = pcVar8;
      arg_settings.public_folder_length = sVar9;
      arg_settings.max_header_size = sVar24;
      arg_settings.max_body_size = sVar10;
      arg_settings.max_clients = iVar11;
      arg_settings.tls = pvVar12;
      arg_settings.reserved1 = iVar13;
      arg_settings.reserved2 = iVar14;
      arg_settings.reserved3 = iVar15;
      arg_settings.ws_max_msg_size = sVar16;
      arg_settings.timeout = uVar17;
      arg_settings.ws_timeout = uVar18;
      arg_settings._122_6_ = uVar19;
      phVar22 = http_settings_new(arg_settings_00);
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
      phVar22->is_client = '\x01';
      if (arg_settings.ws_timeout == '\0') {
        phVar22->ws_timeout = '\0';
      }
      if (arg_settings.timeout == '\0') {
        phVar22->timeout = '\0';
      }
      iVar11 = arg_settings.reserved3;
      sVar9 = arg_settings.ws_max_msg_size;
      iVar13 = arg_settings.reserved2;
      pvVar7 = arg_settings.tls;
      uVar17 = arg_settings.ws_timeout;
      pcVar8 = arg_settings.public_folder;
      uVar18 = arg_settings.timeout;
      uVar19 = arg_settings._122_6_;
      sVar10 = arg_settings.max_header_size;
      sVar16 = arg_settings.max_body_size;
      p_Var6 = arg_settings.on_upgrade;
      pvVar12 = arg_settings.udata;
      iVar14 = arg_settings.max_clients;
      sVar5 = arg_settings.public_folder_length;
      iVar15 = arg_settings.reserved1;
      arg_settings._0_16_ = auVar2;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
      arg_settings._24_104_ = auVar3;
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      arg_settings.on_upgrade = p_Var6;
      arg_settings.udata = pvVar12;
      arg_settings.public_folder = pcVar8;
      arg_settings.public_folder_length = sVar5;
      arg_settings.max_header_size = sVar10;
      arg_settings.max_body_size = sVar16;
      arg_settings.max_clients = iVar14;
      arg_settings.tls = pvVar7;
      arg_settings.reserved1 = iVar15;
      arg_settings.reserved2 = iVar13;
      arg_settings.reserved3 = iVar11;
      arg_settings.ws_max_msg_size = sVar9;
      arg_settings.timeout = uVar18;
      arg_settings.ws_timeout = uVar17;
      arg_settings._122_6_ = uVar19;
      r = (http_s *)fio_malloc(0x80);
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
      arg_settings._0_16_ = auVar2;
      arg_settings._24_104_ = auVar3;
      if (r != (http_s *)0x0) {
        iVar11 = arg_settings.reserved3;
        sVar9 = arg_settings.ws_max_msg_size;
        iVar13 = arg_settings.reserved2;
        pvVar7 = arg_settings.tls;
        uVar17 = arg_settings.ws_timeout;
        pcVar8 = arg_settings.public_folder;
        uVar18 = arg_settings.timeout;
        uVar19 = arg_settings._122_6_;
        sVar10 = arg_settings.max_header_size;
        sVar16 = arg_settings.max_body_size;
        p_Var6 = arg_settings.on_upgrade;
        pvVar12 = arg_settings.udata;
        iVar14 = arg_settings.max_clients;
        sVar5 = arg_settings.public_folder_length;
        iVar15 = arg_settings.reserved1;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        h_00 = r;
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        arg_settings.on_upgrade = p_Var6;
        arg_settings.udata = pvVar12;
        arg_settings.public_folder = pcVar8;
        arg_settings.public_folder_length = sVar5;
        arg_settings.max_header_size = sVar10;
        arg_settings.max_body_size = sVar16;
        arg_settings.max_clients = iVar14;
        arg_settings.tls = pvVar7;
        arg_settings.reserved1 = iVar15;
        arg_settings.reserved2 = iVar13;
        arg_settings.reserved3 = iVar11;
        arg_settings.ws_max_msg_size = sVar9;
        arg_settings.timeout = uVar18;
        arg_settings.ws_timeout = uVar17;
        arg_settings._122_6_ = uVar19;
        vtbl = (http_vtable_s *)http1_vtable();
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        iVar11 = arg_settings.reserved3;
        sVar9 = arg_settings.ws_max_msg_size;
        iVar13 = arg_settings.reserved2;
        pvVar7 = arg_settings.tls;
        uVar17 = arg_settings.ws_timeout;
        pcVar8 = arg_settings.public_folder;
        uVar18 = arg_settings.timeout;
        uVar19 = arg_settings._122_6_;
        sVar10 = arg_settings.max_header_size;
        sVar16 = arg_settings.max_body_size;
        p_Var6 = arg_settings.on_upgrade;
        pvVar12 = arg_settings.udata;
        iVar14 = arg_settings.max_clients;
        sVar5 = arg_settings.public_folder_length;
        iVar15 = arg_settings.reserved1;
        arg_settings._0_16_ = auVar2;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        arg_settings._24_104_ = auVar3;
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        arg_settings.on_upgrade = p_Var6;
        arg_settings.udata = pvVar12;
        arg_settings.public_folder = pcVar8;
        arg_settings.public_folder_length = sVar5;
        arg_settings.max_header_size = sVar10;
        arg_settings.max_body_size = sVar16;
        arg_settings.max_clients = iVar14;
        arg_settings.tls = pvVar7;
        arg_settings.reserved1 = iVar15;
        arg_settings.reserved2 = iVar13;
        arg_settings.reserved3 = iVar11;
        arg_settings.ws_max_msg_size = sVar9;
        arg_settings.timeout = uVar18;
        arg_settings.ws_timeout = uVar17;
        arg_settings._122_6_ = uVar19;
        http_s_new(h_00,(http_fio_protocol_s *)0x0,vtbl);
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        r->udata = arg_settings.udata;
        r->status = 0;
        r->path = (FIOBJ)u.target.data;
        phVar22->udata = r;
        phVar22->tls = arg_settings.tls;
        if (pcStack_48 != (char *)0x0) {
          n.data = "host";
          n.capa = SUB168(ZEXT816(4) << 0x40,0);
          n.len = SUB168(ZEXT816(4) << 0x40,8);
          auVar1._8_8_ = pcStack_48;
          auVar1._0_8_ = a;
          auVar1._16_8_ = 0;
          iVar11 = arg_settings.reserved3;
          sVar9 = arg_settings.ws_max_msg_size;
          iVar13 = arg_settings.reserved2;
          pvVar7 = arg_settings.tls;
          uVar17 = arg_settings.ws_timeout;
          pcVar8 = arg_settings.public_folder;
          uVar18 = arg_settings.timeout;
          uVar19 = arg_settings._122_6_;
          sVar10 = arg_settings.max_header_size;
          sVar16 = arg_settings.max_body_size;
          p_Var6 = arg_settings.on_upgrade;
          pvVar12 = arg_settings.udata;
          iVar14 = arg_settings.max_clients;
          sVar5 = arg_settings.public_folder_length;
          iVar15 = arg_settings.reserved1;
          arg_settings._0_16_ = auVar2;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          arg_settings._24_104_ = auVar3;
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          arg_settings.on_upgrade = p_Var6;
          arg_settings.udata = pvVar12;
          arg_settings.public_folder = pcVar8;
          arg_settings.public_folder_length = sVar5;
          arg_settings.max_header_size = sVar10;
          arg_settings.max_body_size = sVar16;
          arg_settings.max_clients = iVar14;
          arg_settings.tls = pvVar7;
          arg_settings.reserved1 = iVar15;
          arg_settings.reserved2 = iVar13;
          arg_settings.reserved3 = iVar11;
          arg_settings.ws_max_msg_size = sVar9;
          arg_settings.timeout = uVar18;
          arg_settings.ws_timeout = uVar17;
          arg_settings._122_6_ = uVar19;
          http_set_header2(r,n,(fio_str_info_s)(auVar1 << 0x40));
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
        }
        arg_settings._24_104_ = auVar3;
        arg_settings._0_16_ = auVar2;
        uVar19 = arg_settings._122_6_;
        uVar18 = arg_settings.ws_timeout;
        uVar17 = arg_settings.timeout;
        sVar5 = arg_settings.ws_max_msg_size;
        iVar15 = arg_settings.reserved3;
        iVar14 = arg_settings.reserved2;
        iVar13 = arg_settings.reserved1;
        pvVar12 = arg_settings.tls;
        iVar11 = arg_settings.max_clients;
        sVar16 = arg_settings.max_body_size;
        sVar10 = arg_settings.max_header_size;
        sVar9 = arg_settings.public_folder_length;
        pcVar8 = arg_settings.public_folder;
        pvVar7 = arg_settings.udata;
        p_Var6 = arg_settings.on_upgrade;
        arg_settings.on_upgrade = p_Var6;
        arg_settings.udata = pvVar7;
        arg_settings.public_folder = pcVar8;
        arg_settings.public_folder_length = sVar9;
        arg_settings.max_header_size = sVar10;
        arg_settings.max_body_size = sVar16;
        arg_settings.max_clients = iVar11;
        arg_settings.tls = pvVar12;
        arg_settings.reserved1 = iVar13;
        arg_settings.reserved2 = iVar14;
        arg_settings.reserved3 = iVar15;
        arg_settings.ws_max_msg_size = sVar5;
        arg_settings.timeout = uVar17;
        arg_settings.ws_timeout = uVar18;
        arg_settings._122_6_ = uVar19;
        if (bVar4) {
          args.port = (char *)http_on_open_client;
          args.address = host;
          args.on_connect = http_on_client_failed;
          args.on_fail = (_func_void_intptr_t_void_ptr *)pvVar12;
          args.tls = phVar22;
          args.udata = (void *)((ulong)uStack_167 << 8);
          args._48_8_ = sVar24;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          local_160 = fio_connect(args);
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
        }
        else {
          args_00.port = (char *)http_on_open_client;
          args_00.address = host;
          args_00.on_connect = http_on_client_failed;
          args_00.on_fail = (_func_void_intptr_t_void_ptr *)pvVar12;
          args_00.tls = phVar22;
          args_00.udata = (void *)((ulong)uStack_19f << 8);
          args_00._48_8_ = sVar24;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          local_160 = fio_connect(args_00);
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
        }
        arg_settings._24_104_ = auVar3;
        arg_settings._0_16_ = auVar2;
        uVar19 = arg_settings._122_6_;
        uVar18 = arg_settings.ws_timeout;
        uVar17 = arg_settings.timeout;
        sVar16 = arg_settings.ws_max_msg_size;
        iVar15 = arg_settings.reserved3;
        iVar14 = arg_settings.reserved2;
        iVar13 = arg_settings.reserved1;
        pvVar12 = arg_settings.tls;
        iVar11 = arg_settings.max_clients;
        sVar10 = arg_settings.max_body_size;
        sVar24 = arg_settings.max_header_size;
        sVar9 = arg_settings.public_folder_length;
        pcVar8 = arg_settings.public_folder;
        pvVar7 = arg_settings.udata;
        p_Var6 = arg_settings.on_upgrade;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        if (p != unix_address) {
          arg_settings.on_upgrade = p_Var6;
          arg_settings.udata = pvVar7;
          arg_settings.public_folder = pcVar8;
          arg_settings.public_folder_length = sVar9;
          arg_settings.max_header_size = sVar24;
          arg_settings.max_body_size = sVar10;
          arg_settings.max_clients = iVar11;
          arg_settings.tls = pvVar12;
          arg_settings.reserved1 = iVar13;
          arg_settings.reserved2 = iVar14;
          arg_settings.reserved3 = iVar15;
          arg_settings.ws_max_msg_size = sVar16;
          arg_settings.timeout = uVar17;
          arg_settings.ws_timeout = uVar18;
          arg_settings._122_6_ = uVar19;
          fio_free(p);
          auVar3 = (undefined1  [104])arg_settings._24_104_;
          auVar2 = (undefined1  [16])arg_settings._0_16_;
          p_Var6 = arg_settings.on_upgrade;
          pvVar7 = arg_settings.udata;
          pcVar8 = arg_settings.public_folder;
          sVar9 = arg_settings.public_folder_length;
          sVar24 = arg_settings.max_header_size;
          sVar10 = arg_settings.max_body_size;
          iVar11 = arg_settings.max_clients;
          pvVar12 = arg_settings.tls;
          iVar13 = arg_settings.reserved1;
          iVar14 = arg_settings.reserved2;
          iVar15 = arg_settings.reserved3;
          sVar16 = arg_settings.ws_max_msg_size;
          uVar17 = arg_settings.timeout;
          uVar18 = arg_settings.ws_timeout;
          uVar19 = arg_settings._122_6_;
        }
        arg_settings._122_6_ = uVar19;
        arg_settings.ws_timeout = uVar18;
        arg_settings.timeout = uVar17;
        arg_settings.ws_max_msg_size = sVar16;
        arg_settings.reserved3 = iVar15;
        arg_settings.reserved2 = iVar14;
        arg_settings.reserved1 = iVar13;
        arg_settings.tls = pvVar12;
        arg_settings.max_clients = iVar11;
        arg_settings.max_body_size = sVar10;
        arg_settings.max_header_size = sVar24;
        arg_settings.public_folder_length = sVar9;
        arg_settings.public_folder = pcVar8;
        arg_settings.udata = pvVar7;
        arg_settings.on_upgrade = p_Var6;
        arg_settings._24_104_ = auVar3;
        arg_settings._0_16_ = auVar2;
        uVar19 = arg_settings._122_6_;
        uVar18 = arg_settings.ws_timeout;
        uVar17 = arg_settings.timeout;
        sVar16 = arg_settings.ws_max_msg_size;
        iVar15 = arg_settings.reserved3;
        iVar14 = arg_settings.reserved2;
        iVar13 = arg_settings.reserved1;
        pvVar12 = arg_settings.tls;
        iVar11 = arg_settings.max_clients;
        sVar10 = arg_settings.max_body_size;
        sVar24 = arg_settings.max_header_size;
        sVar9 = arg_settings.public_folder_length;
        pcVar8 = arg_settings.public_folder;
        pvVar7 = arg_settings.udata;
        p_Var6 = arg_settings.on_upgrade;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        arg_settings.on_upgrade = p_Var6;
        arg_settings.udata = pvVar7;
        arg_settings.public_folder = pcVar8;
        arg_settings.public_folder_length = sVar9;
        arg_settings.max_header_size = sVar24;
        arg_settings.max_body_size = sVar10;
        arg_settings.max_clients = iVar11;
        arg_settings.tls = pvVar12;
        arg_settings.reserved1 = iVar13;
        arg_settings.reserved2 = iVar14;
        arg_settings.reserved3 = iVar15;
        arg_settings.ws_max_msg_size = sVar16;
        arg_settings.timeout = uVar17;
        arg_settings.ws_timeout = uVar18;
        arg_settings._122_6_ = uVar19;
        fio_free(host);
        return local_160;
      }
      if (0 < FIO_LOG_LEVEL) {
        iVar11 = arg_settings.reserved3;
        sVar9 = arg_settings.ws_max_msg_size;
        iVar13 = arg_settings.reserved2;
        pvVar7 = arg_settings.tls;
        uVar17 = arg_settings.ws_timeout;
        pcVar8 = arg_settings.public_folder;
        uVar18 = arg_settings.timeout;
        uVar19 = arg_settings._122_6_;
        sVar24 = arg_settings.max_header_size;
        sVar10 = arg_settings.max_body_size;
        p_Var6 = arg_settings.on_upgrade;
        pvVar12 = arg_settings.udata;
        iVar14 = arg_settings.max_clients;
        sVar16 = arg_settings.public_folder_length;
        iVar15 = arg_settings.reserved1;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        arg_settings.on_upgrade = p_Var6;
        arg_settings.udata = pvVar12;
        arg_settings.public_folder = pcVar8;
        arg_settings.public_folder_length = sVar16;
        arg_settings.max_header_size = sVar24;
        arg_settings.max_body_size = sVar10;
        arg_settings.max_clients = iVar14;
        arg_settings.tls = pvVar7;
        arg_settings.reserved1 = iVar15;
        arg_settings.reserved2 = iVar13;
        arg_settings.reserved3 = iVar11;
        arg_settings.ws_max_msg_size = sVar9;
        arg_settings.timeout = uVar18;
        arg_settings.ws_timeout = uVar17;
        arg_settings._122_6_ = uVar19;
        FIO_LOG2STDERR(
                      "FATAL: (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/http/http.c:1123) HTTP Client handler allocation failed"
                      );
        auVar3 = (undefined1  [104])arg_settings._24_104_;
        auVar2 = (undefined1  [16])arg_settings._0_16_;
      }
      arg_settings._24_104_ = auVar3;
      arg_settings._0_16_ = auVar2;
      uVar19 = arg_settings._122_6_;
      uVar18 = arg_settings.ws_timeout;
      uVar17 = arg_settings.timeout;
      sVar16 = arg_settings.ws_max_msg_size;
      iVar15 = arg_settings.reserved3;
      iVar14 = arg_settings.reserved2;
      iVar13 = arg_settings.reserved1;
      pvVar12 = arg_settings.tls;
      iVar11 = arg_settings.max_clients;
      sVar10 = arg_settings.max_body_size;
      sVar24 = arg_settings.max_header_size;
      sVar9 = arg_settings.public_folder_length;
      pcVar8 = arg_settings.public_folder;
      pvVar7 = arg_settings.udata;
      p_Var6 = arg_settings.on_upgrade;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      arg_settings.on_upgrade = p_Var6;
      arg_settings.udata = pvVar7;
      arg_settings.public_folder = pcVar8;
      arg_settings.public_folder_length = sVar9;
      arg_settings.max_header_size = sVar24;
      arg_settings.max_body_size = sVar10;
      arg_settings.max_clients = iVar11;
      arg_settings.tls = pvVar12;
      arg_settings.reserved1 = iVar13;
      arg_settings.reserved2 = iVar14;
      arg_settings.reserved3 = iVar15;
      arg_settings.ws_max_msg_size = sVar16;
      arg_settings.timeout = uVar17;
      arg_settings.ws_timeout = uVar18;
      arg_settings._122_6_ = uVar19;
      perror("     errno");
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
      iVar11 = arg_settings.reserved3;
      sVar9 = arg_settings.ws_max_msg_size;
      iVar13 = arg_settings.reserved2;
      pvVar7 = arg_settings.tls;
      uVar17 = arg_settings.ws_timeout;
      pcVar8 = arg_settings.public_folder;
      uVar18 = arg_settings.timeout;
      uVar19 = arg_settings._122_6_;
      sVar24 = arg_settings.max_header_size;
      sVar10 = arg_settings.max_body_size;
      p_Var6 = arg_settings.on_upgrade;
      pvVar12 = arg_settings.udata;
      iVar14 = arg_settings.max_clients;
      sVar16 = arg_settings.public_folder_length;
      iVar15 = arg_settings.reserved1;
      arg_settings._0_16_ = auVar2;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
      arg_settings._24_104_ = auVar3;
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      arg_settings.on_upgrade = p_Var6;
      arg_settings.udata = pvVar12;
      arg_settings.public_folder = pcVar8;
      arg_settings.public_folder_length = sVar16;
      arg_settings.max_header_size = sVar24;
      arg_settings.max_body_size = sVar10;
      arg_settings.max_clients = iVar14;
      arg_settings.tls = pvVar7;
      arg_settings.reserved1 = iVar15;
      arg_settings.reserved2 = iVar13;
      arg_settings.reserved3 = iVar11;
      arg_settings.ws_max_msg_size = sVar9;
      arg_settings.timeout = uVar18;
      arg_settings.ws_timeout = uVar17;
      arg_settings._122_6_ = uVar19;
      exit(-1);
    }
    if (1 < FIO_LOG_LEVEL) {
      iVar11 = arg_settings.reserved3;
      sVar9 = arg_settings.ws_max_msg_size;
      iVar13 = arg_settings.reserved2;
      pvVar7 = arg_settings.tls;
      uVar17 = arg_settings.ws_timeout;
      pcVar8 = arg_settings.public_folder;
      uVar18 = arg_settings.timeout;
      uVar19 = arg_settings._122_6_;
      sVar24 = arg_settings.max_header_size;
      sVar10 = arg_settings.max_body_size;
      p_Var6 = arg_settings.on_upgrade;
      pvVar12 = arg_settings.udata;
      iVar14 = arg_settings.max_clients;
      sVar16 = arg_settings.public_folder_length;
      iVar15 = arg_settings.reserved1;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      arg_settings.on_upgrade = p_Var6;
      arg_settings.udata = pvVar12;
      arg_settings.public_folder = pcVar8;
      arg_settings.public_folder_length = sVar16;
      arg_settings.max_header_size = sVar24;
      arg_settings.max_body_size = sVar10;
      arg_settings.max_clients = iVar14;
      arg_settings.tls = pvVar7;
      arg_settings.reserved1 = iVar15;
      arg_settings.reserved2 = iVar13;
      arg_settings.reserved3 = iVar11;
      arg_settings.ws_max_msg_size = sVar9;
      arg_settings.timeout = uVar18;
      arg_settings.ws_timeout = uVar17;
      arg_settings._122_6_ = uVar19;
      FIO_LOG2STDERR("ERROR: http_connect requires a valid address.");
      auVar3 = (undefined1  [104])arg_settings._24_104_;
      auVar2 = (undefined1  [16])arg_settings._0_16_;
    }
    arg_settings._24_104_ = auVar3;
    arg_settings._0_16_ = auVar2;
    uVar19 = arg_settings._122_6_;
    uVar18 = arg_settings.ws_timeout;
    uVar17 = arg_settings.timeout;
    sVar16 = arg_settings.ws_max_msg_size;
    iVar15 = arg_settings.reserved3;
    iVar14 = arg_settings.reserved2;
    iVar13 = arg_settings.reserved1;
    pvVar12 = arg_settings.tls;
    iVar11 = arg_settings.max_clients;
    sVar10 = arg_settings.max_body_size;
    sVar24 = arg_settings.max_header_size;
    sVar9 = arg_settings.public_folder_length;
    pcVar8 = arg_settings.public_folder;
    pvVar7 = arg_settings.udata;
    p_Var6 = arg_settings.on_upgrade;
    auVar2 = (undefined1  [16])arg_settings._0_16_;
    auVar3 = (undefined1  [104])arg_settings._24_104_;
    arg_settings.on_upgrade = p_Var6;
    arg_settings.udata = pvVar7;
    arg_settings.public_folder = pcVar8;
    arg_settings.public_folder_length = sVar9;
    arg_settings.max_header_size = sVar24;
    arg_settings.max_body_size = sVar10;
    arg_settings.max_clients = iVar11;
    arg_settings.tls = pvVar12;
    arg_settings.reserved1 = iVar13;
    arg_settings.reserved2 = iVar14;
    arg_settings.reserved3 = iVar15;
    arg_settings.ws_max_msg_size = sVar16;
    arg_settings.timeout = uVar17;
    arg_settings.ws_timeout = uVar18;
    arg_settings._122_6_ = uVar19;
    piVar20 = __errno_location();
    auVar3 = (undefined1  [104])arg_settings._24_104_;
    auVar2 = (undefined1  [16])arg_settings._0_16_;
    *piVar20 = 0x16;
  }
LAB_0017403b:
  arg_settings._24_104_ = auVar3;
  arg_settings._0_16_ = auVar2;
  uVar19 = arg_settings._122_6_;
  uVar18 = arg_settings.ws_timeout;
  uVar17 = arg_settings.timeout;
  sVar16 = arg_settings.ws_max_msg_size;
  iVar15 = arg_settings.reserved3;
  iVar14 = arg_settings.reserved2;
  iVar13 = arg_settings.reserved1;
  pvVar12 = arg_settings.tls;
  iVar11 = arg_settings.max_clients;
  sVar10 = arg_settings.max_body_size;
  sVar24 = arg_settings.max_header_size;
  sVar9 = arg_settings.public_folder_length;
  pcVar8 = arg_settings.public_folder;
  pvVar7 = arg_settings.udata;
  auVar3 = (undefined1  [104])arg_settings._24_104_;
  p_Var6 = arg_settings.on_upgrade;
  if ((long)arg_settings._24_104_ != 0) {
    auVar2 = (undefined1  [16])arg_settings._0_16_;
    arg_settings.on_upgrade = p_Var6;
    arg_settings.udata = pvVar7;
    arg_settings.public_folder = pcVar8;
    arg_settings.public_folder_length = sVar9;
    arg_settings.max_header_size = sVar24;
    arg_settings.max_body_size = sVar10;
    arg_settings.max_clients = iVar11;
    arg_settings.tls = pvVar12;
    arg_settings.reserved1 = iVar13;
    arg_settings.reserved2 = iVar14;
    arg_settings.reserved3 = iVar15;
    arg_settings.ws_max_msg_size = sVar16;
    arg_settings.timeout = uVar17;
    arg_settings.ws_timeout = uVar18;
    arg_settings._122_6_ = uVar19;
    (*(code *)auVar3)(&arg_settings);
  }
  return -1;
}

Assistant:

intptr_t http_connect FIO_IGNORE_MACRO(const char *url,
                                       const char *unix_address,
                                       struct http_settings_s arg_settings) {
  if (!arg_settings.on_response && !arg_settings.on_upgrade) {
    FIO_LOG_ERROR("http_connect requires either an on_response "
                  " or an on_upgrade callback.\n");
    errno = EINVAL;
    goto on_error;
  }
  size_t len = 0, h_len = 0;
  char *a = NULL, *p = NULL, *host = NULL;
  uint8_t is_websocket = 0;
  uint8_t is_secure = 0;
  FIOBJ path = FIOBJ_INVALID;
  if (!url && !unix_address) {
    FIO_LOG_ERROR("http_connect requires a valid address.");
    errno = EINVAL;
    goto on_error;
  }
  if (url) {
    fio_url_s u = fio_url_parse(url, strlen(url));
    if (u.scheme.data &&
        (u.scheme.len == 2 || (u.scheme.len == 3 && u.scheme.data[2] == 's')) &&
        u.scheme.data[0] == 'w' && u.scheme.data[1] == 's') {
      is_websocket = 1;
      is_secure = (u.scheme.len == 3);
    } else if (u.scheme.data &&
               (u.scheme.len == 4 ||
                (u.scheme.len == 5 && u.scheme.data[4] == 's')) &&
               u.scheme.data[0] == 'h' && u.scheme.data[1] == 't' &&
               u.scheme.data[2] == 't' && u.scheme.data[3] == 'p') {
      is_secure = (u.scheme.len == 5);
    }
    if (is_secure && !arg_settings.tls) {
      FIO_LOG_ERROR("Secure connections (%.*s) require a TLS object.",
                    (int)u.scheme.len, u.scheme.data);
      errno = EINVAL;
      goto on_error;
    }
    if (u.path.data) {
      path = fiobj_str_new(
          u.path.data, strlen(u.path.data)); /* copy query and target as well */
    }
    if (unix_address) {
      a = (char *)unix_address;
      h_len = len = strlen(a);
      host = a;
    } else {
      if (!u.host.data) {
        FIO_LOG_ERROR("http_connect requires a valid address.");
        errno = EINVAL;
        goto on_error;
      }
      /***** no more error handling, since memory is allocated *****/
      /* copy address */
      a = fio_malloc(u.host.len + 1);
      memcpy(a, u.host.data, u.host.len);
      a[u.host.len] = 0;
      len = u.host.len;
      /* copy port */
      if (u.port.data) {
        p = fio_malloc(u.port.len + 1);
        memcpy(p, u.port.data, u.port.len);
        p[u.port.len] = 0;
      } else if (is_secure) {
        p = fio_malloc(3 + 1);
        memcpy(p, "443", 3);
        p[3] = 0;
      } else {
        p = fio_malloc(2 + 1);
        memcpy(p, "80", 2);
        p[2] = 0;
      }
    }
    if (u.host.data) {
      host = u.host.data;
      h_len = u.host.len;
    }
  }

  /* set settings */
  if (!arg_settings.timeout)
    arg_settings.timeout = 30;
  http_settings_s *settings = http_settings_new(arg_settings);
  settings->is_client = 1;
  // if (settings->tls) {
  //   fio_tls_alpn_add(settings->tls, "http/1.1", http_on_open_client_http1,
  //                     NULL, NULL);
  // }

  if (!arg_settings.ws_timeout)
    settings->ws_timeout = 0; /* allow server to dictate timeout */
  if (!arg_settings.timeout)
    settings->timeout = 0; /* allow server to dictate timeout */
  http_s *h = fio_malloc(sizeof(*h));
  FIO_ASSERT(h, "HTTP Client handler allocation failed");
  http_s_new(h, 0, http1_vtable());
  h->udata = arg_settings.udata;
  h->status = 0;
  h->path = path;
  settings->udata = h;
  settings->tls = arg_settings.tls;
  if (host)
    http_set_header2(h, (fio_str_info_s){.data = (char *)"host", .len = 4},
                     (fio_str_info_s){.data = host, .len = h_len});
  intptr_t ret;
  if (is_websocket) {
    /* force HTTP/1.1 */
    ret = fio_connect(.address = a, .port = p, .on_fail = http_on_client_failed,
                      .on_connect = http_on_open_client, .udata = settings,
                      .tls = arg_settings.tls);
    (void)0;
  } else {
    /* Allow for any HTTP version */
    ret = fio_connect(.address = a, .port = p, .on_fail = http_on_client_failed,
                      .on_connect = http_on_open_client, .udata = settings,
                      .tls = arg_settings.tls);
    (void)0;
  }
  if (a != unix_address)
    fio_free(a);
  fio_free(p);
  return ret;
on_error:
  if (arg_settings.on_finish)
    arg_settings.on_finish(&arg_settings);
  return -1;
}